

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogFile.cpp
# Opt level: O3

void __thiscall LogFile::put_write_string(LogFile *this,char *buff)

{
  iterator *piVar1;
  _Elt_pointer ppcVar2;
  char *local_20;
  
  local_20 = buff;
  pthread_mutex_lock((pthread_mutex_t *)&this->put_Mutex);
  ppcVar2 = (this->Wait_WriteTask).c.super__Deque_base<char_*,_std::allocator<char_*>_>._M_impl.
            super__Deque_impl_data._M_finish._M_cur;
  if (ppcVar2 ==
      (this->Wait_WriteTask).c.super__Deque_base<char_*,_std::allocator<char_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_last + -1) {
    std::deque<char*,std::allocator<char*>>::_M_push_back_aux<char*const&>
              ((deque<char*,std::allocator<char*>> *)&this->Wait_WriteTask,&local_20);
  }
  else {
    *ppcVar2 = buff;
    piVar1 = &(this->Wait_WriteTask).c.super__Deque_base<char_*,_std::allocator<char_*>_>._M_impl.
              super__Deque_impl_data._M_finish;
    piVar1->_M_cur = piVar1->_M_cur + 1;
  }
  pthread_cond_broadcast((pthread_cond_t *)&this->Swap_Cond);
  pthread_mutex_unlock((pthread_mutex_t *)&this->put_Mutex);
  return;
}

Assistant:

void LogFile::put_write_string(char* buff)
{
    pthread_mutex_lock(&put_Mutex);
    Wait_WriteTask.push(buff);
    pthread_cond_broadcast(&Swap_Cond);
    pthread_mutex_unlock(&put_Mutex);
}